

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::has_alpha(image_u8 *img)

{
  uint uVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  uint local_20;
  uint local_1c;
  uint x;
  uint y;
  image_u8 *img_local;
  
  local_1c = 0;
  do {
    uVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(img);
    if (uVar1 <= local_1c) {
      return false;
    }
    for (local_20 = 0; uVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img),
        local_20 < uVar1; local_20 = local_20 + 1) {
      pcVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()(img,local_20,local_1c);
      if ((pcVar2->field_0).field_0.a != 0xff) {
        return true;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool has_alpha(const image_u8& img)
        {
            for (uint y = 0; y < img.get_height(); y++)
            {
                for (uint x = 0; x < img.get_width(); x++)
                {
                    if (img(x, y).a < 255)
                    {
                        return true;
                    }
                }
            }

            return false;
        }